

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdMMX>::RGB2YUV(ImplSimd<SimdMMX> *this,RGB *rgb,YUV420 *yuv)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *dst;
  uint8_t *dst_00;
  uint8_t *dst_01;
  longlong local_2e8 [4];
  longlong local_2c8 [4];
  longlong local_2a8;
  longlong local_2a0 [4];
  longlong local_280;
  longlong local_278 [3];
  longlong local_260;
  longlong local_258;
  longlong local_250;
  longlong local_248;
  longlong local_240;
  longlong local_238;
  SimdMMX local_230 [24];
  longlong local_218 [4];
  longlong local_1f8 [4];
  longlong local_1d8;
  longlong local_1d0 [4];
  longlong local_1b0;
  longlong local_1a8 [3];
  longlong local_190;
  longlong local_188;
  longlong local_180;
  longlong local_178;
  longlong local_170;
  longlong local_168;
  SimdMMX local_160 [24];
  longlong local_148 [4];
  longlong local_128 [4];
  longlong local_108;
  longlong local_100 [4];
  longlong local_e0;
  longlong local_d8 [3];
  longlong local_c0;
  longlong local_b8;
  longlong local_b0;
  longlong local_a8;
  longlong local_a0;
  longlong local_98;
  SimdMMX local_90 [16];
  longlong local_80;
  Vector e;
  longlong local_70;
  Vector d;
  longlong local_60;
  Vector c;
  size_t i;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t *v;
  uint8_t *u;
  uint8_t *y;
  YUV420 *yuv_local;
  RGB *rgb_local;
  ImplSimd<SimdMMX> *this_local;
  
  if (yuv->height_ != rgb->height_) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]")
    ;
  }
  if (yuv->width_ == rgb->width_) {
    if ((yuv->size_ & 3) == 0) {
      puVar1 = yuv->y_;
      puVar2 = yuv->u_;
      puVar3 = yuv->v_;
      puVar4 = rgb->r_;
      puVar5 = rgb->g_;
      puVar6 = rgb->b_;
      for (c[0] = 0; (ulong)c[0] < yuv->size_; c[0] = c[0] + 4) {
        SimdMMX::Load(puVar4 + c[0]);
        SimdMMX::Load(puVar5 + c[0]);
        SimdMMX::Load(puVar6 + c[0]);
        SimdMMX::Constant(0x42);
        SimdMMX::Mul((VectorType *)&local_c0,(VectorType *)&local_60);
        SimdMMX::Constant(0x81);
        SimdMMX::Mul((VectorType *)&local_e0,(VectorType *)&local_70);
        SimdMMX::Add((VectorType *)&local_b8,(VectorType *)local_d8);
        SimdMMX::Constant(0x19);
        SimdMMX::Mul((VectorType *)&local_108,(VectorType *)&local_80);
        SimdMMX::Add((VectorType *)&local_b0,(VectorType *)local_100);
        SimdMMX::Constant(0x80);
        SimdMMX::Add((VectorType *)&local_a8,(VectorType *)local_128);
        SimdMMX::Rli((VectorType *)&local_a0,8);
        SimdMMX::Constant(0x10);
        SimdMMX::Add((VectorType *)&local_98,(VectorType *)local_148);
        SimdMMX::Store(local_90,(VectorType *)(puVar1 + c[0]),dst);
        SimdMMX::Constant(0x70);
        SimdMMX::Mul((VectorType *)&local_190,(VectorType *)&local_80);
        SimdMMX::Constant(0x26);
        SimdMMX::Mul((VectorType *)&local_1b0,(VectorType *)&local_60);
        SimdMMX::Sub((VectorType *)&local_188,(VectorType *)local_1a8);
        SimdMMX::Constant(0x4a);
        SimdMMX::Mul((VectorType *)&local_1d8,(VectorType *)&local_70);
        SimdMMX::Sub((VectorType *)&local_180,(VectorType *)local_1d0);
        SimdMMX::Constant(0x80);
        SimdMMX::Add((VectorType *)&local_178,(VectorType *)local_1f8);
        SimdMMX::Rli((VectorType *)&local_170,8);
        SimdMMX::Constant(0x80);
        SimdMMX::Add((VectorType *)&local_168,(VectorType *)local_218);
        SimdMMX::Store(local_160,(VectorType *)(puVar2 + c[0]),dst_00);
        SimdMMX::Constant(0x70);
        SimdMMX::Mul((VectorType *)&local_260,(VectorType *)&local_60);
        SimdMMX::Constant(0x5e);
        SimdMMX::Mul((VectorType *)&local_280,(VectorType *)&local_70);
        SimdMMX::Sub((VectorType *)&local_258,(VectorType *)local_278);
        SimdMMX::Constant(0x12);
        SimdMMX::Mul((VectorType *)&local_2a8,(VectorType *)&local_80);
        SimdMMX::Sub((VectorType *)&local_250,(VectorType *)local_2a0);
        SimdMMX::Constant(0x80);
        SimdMMX::Add((VectorType *)&local_248,(VectorType *)local_2c8);
        SimdMMX::Rli((VectorType *)&local_240,8);
        SimdMMX::Constant(0x80);
        SimdMMX::Add((VectorType *)&local_238,(VectorType *)local_2e8);
        SimdMMX::Store(local_230,(VectorType *)(puVar3 + c[0]),dst_01);
        SimdMMX::Empty();
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]")
    ;
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]");
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}